

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declnode.cpp
# Opt level: O3

void __thiscall
DeclNode::check(DeclNode *this,
               vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
               *tables)

{
  pointer pmVar1;
  VarNode *pVVar2;
  TypeNode *pTVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  runtime_error *this_00;
  long *plVar6;
  char *pcVar7;
  size_type *psVar8;
  string varScope;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  string local_170;
  string local_150;
  string local_130;
  SymbolInfo local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
  local_b0;
  
  bVar5 = wasDeclared(tables,&((this->var)._M_t.
                               super___uniq_ptr_impl<VarNode,_std::default_delete<VarNode>_>._M_t.
                               super__Tuple_impl<0UL,_VarNode_*,_std::default_delete<VarNode>_>.
                               super__Head_base<0UL,_VarNode_*,_false>._M_head_impl)->name);
  if (!bVar5) {
    local_188 = 0;
    local_180 = 0;
    pcVar7 = "local";
    if ((long)(tables->
              super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(tables->
              super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x30) {
      pcVar7 = "global";
    }
    local_190 = &local_180;
    std::__cxx11::string::_M_replace((ulong)&local_190,0,(char *)0x0,(ulong)pcVar7);
    pmVar1 = (tables->
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pVVar2 = (this->var)._M_t.super___uniq_ptr_impl<VarNode,_std::default_delete<VarNode>_>._M_t.
             super__Tuple_impl<0UL,_VarNode_*,_std::default_delete<VarNode>_>.
             super__Head_base<0UL,_VarNode_*,_false>._M_head_impl;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"var","");
    pTVar3 = (this->type)._M_t.super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>._M_t.
             super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>.
             super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl;
    _Var4._M_p = (pTVar3->name)._M_dataplus._M_p;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,_Var4._M_p,_Var4._M_p + (pTVar3->name)._M_string_length);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_190,local_190 + local_188);
    SymbolInfo::SymbolInfo(&local_110,&local_130,&local_150,&local_170);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_SymbolInfo,_true>
              (&local_b0,&pVVar2->name,&local_110);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,SymbolInfo>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
                *)(pmVar1 + -1),&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.scope._M_dataplus._M_p != &local_b0.second.scope.field_2) {
      operator_delete(local_b0.second.scope._M_dataplus._M_p,
                      local_b0.second.scope.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.type._M_dataplus._M_p != &local_b0.second.type.field_2) {
      operator_delete(local_b0.second.type._M_dataplus._M_p,
                      local_b0.second.type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.kind._M_dataplus._M_p != &local_b0.second.kind.field_2) {
      operator_delete(local_b0.second.kind._M_dataplus._M_p,
                      local_b0.second.kind.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      local_b0.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.scope._M_dataplus._M_p != &local_110.scope.field_2) {
      operator_delete(local_110.scope._M_dataplus._M_p,
                      local_110.scope.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.type._M_dataplus._M_p != &local_110.type.field_2) {
      operator_delete(local_110.type._M_dataplus._M_p,
                      local_110.type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.kind._M_dataplus._M_p != &local_110.kind.field_2) {
      operator_delete(local_110.kind._M_dataplus._M_p,
                      local_110.kind.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_110.kind,"error: multiple definition of \'",
                 &((this->var)._M_t.super___uniq_ptr_impl<VarNode,_std::default_delete<VarNode>_>.
                   _M_t.super__Tuple_impl<0UL,_VarNode_*,_std::default_delete<VarNode>_>.
                   super__Head_base<0UL,_VarNode_*,_false>._M_head_impl)->name);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_b0.first._M_dataplus._M_p = (pointer)*plVar6;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_b0.first._M_dataplus._M_p == psVar8) {
    local_b0.first.field_2._M_allocated_capacity = *psVar8;
    local_b0.first.field_2._8_8_ = plVar6[3];
    local_b0.first._M_dataplus._M_p = (pointer)&local_b0.first.field_2;
  }
  else {
    local_b0.first.field_2._M_allocated_capacity = *psVar8;
  }
  local_b0.first._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_b0);
  *(undefined ***)this_00 = &PTR__runtime_error_00139738;
  __cxa_throw(this_00,&SemanticException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DeclNode::check(std::vector<SymbolTable>& tables) {
    if (wasDeclared(tables, var->name)) {
        throw SemanticException("error: multiple definition of '" + var->name + "'");
    } else {
        auto varScope = std::string();
        if (tables.size() == 1) {
            varScope = "global";
        } else {
            varScope = "local";
        }

        tables.back().emplace(std::make_pair(var->name, SymbolInfo("var", type->name, varScope)));
//        std::cout << "new var added to table: named " << var->name << ", type: "
//                  << type->name << ", scope: " << varScope << "\n";
    }
}